

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall AST::AST(AST *this,string *filename)

{
  pointer pcVar1;
  _Elt_pointer ppPVar2;
  _Elt_pointer ppPVar3;
  bool bVar4;
  ostream *poVar5;
  GLRP *pGVar6;
  GLRParser *this_00;
  ASTree *this_01;
  _Elt_pointer ppPVar7;
  string *psVar8;
  _Base_ptr p_Var9;
  runtime_error *this_02;
  string parseString;
  set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  parsedVersions;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  nonTerminals;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  glrNonTerminals;
  stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_> productions;
  stringstream buffer;
  ifstream t;
  string local_4e8;
  AST *local_4c8;
  string local_4c0;
  _Rb_tree<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::_Identity<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  local_4a0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_470;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_440;
  _Deque_base<Production_*,_std::allocator<Production_*>_> local_410;
  stringstream local_3c0 [16];
  ostream local_3b0 [112];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  streambuf local_228 [504];
  
  local_4c8 = this;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Creating an AST for ",0x14);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(filename->_M_dataplus)._M_p,filename->_M_string_length)
  ;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  std::ostream::flush();
  pGVar6 = GLRP::getInstance();
  bVar4 = GLRP::isLoaded(pGVar6);
  if (!bVar4) {
    pGVar6 = GLRP::getInstance();
    GLRP::loadParser(pGVar6);
  }
  pGVar6 = GLRP::getInstance();
  this_00 = GLRP::getGlrParser(pGVar6);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Parsing string...",0x11)
  ;
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  std::__cxx11::stringstream::stringstream(local_3c0);
  std::ostream::operator<<(local_3b0,local_228);
  std::__cxx11::stringbuf::str();
  GLRParser::parseString
            ((set<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
              *)&local_4a0,this_00,&local_4c0);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Done parsing",0xc);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + '\x18');
  std::ostream::put('\x18');
  std::ostream::flush();
  if (local_4a0._M_impl.super__Rb_tree_header._M_node_count != 1) {
    if (local_4a0._M_impl.super__Rb_tree_header._M_node_count == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Error parsing: Incorrect code",0x1d);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cerr);
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_02,"Parsing error");
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Error parsing: Code has ambiguities, taking the first one",
               0x39);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
  }
  GLRParser::getNonTerminalsV_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_440,this_00);
  std::
  set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>::
  set<std::_Rb_tree_const_iterator<std::__cxx11::string>>
            ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
              *)&local_470,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_440._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )&local_440._M_impl.super__Rb_tree_header);
  if ((_Rb_tree_header *)local_4a0._M_impl.super__Rb_tree_header._M_header._M_left !=
      &local_4a0._M_impl.super__Rb_tree_header) {
    p_Var9 = local_4a0._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      std::deque<Production_*,_std::allocator<Production_*>_>::deque
                ((deque<Production_*,_std::allocator<Production_*>_> *)&local_410,
                 (deque<Production_*,_std::allocator<Production_*>_> *)(p_Var9 + 1));
      ppPVar3 = local_410._M_impl.super__Deque_impl_data._M_finish._M_cur;
      ppPVar2 = local_410._M_impl.super__Deque_impl_data._M_start._M_cur;
      if (local_410._M_impl.super__Deque_impl_data._M_finish._M_cur ==
          local_410._M_impl.super__Deque_impl_data._M_start._M_cur) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error: Empty productions",0x18);
        std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + 'h');
        std::ostream::put('h');
        std::ostream::flush();
      }
      else {
        this_01 = (ASTree *)operator_new(0x40);
        ppPVar7 = ppPVar3;
        if (ppPVar3 == local_410._M_impl.super__Deque_impl_data._M_finish._M_first) {
          ppPVar7 = local_410._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
        }
        psVar8 = Production::getFromP_abi_cxx11_(ppPVar7[-1]);
        local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
        pcVar1 = (psVar8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_4e8,pcVar1,pcVar1 + psVar8->_M_string_length);
        ASTree::ASTree(this_01,(stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>
                                *)&local_410,
                       (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_470,&local_4e8,(ASTree *)0x0);
        local_4c8->ast = this_01;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_4e8._M_dataplus._M_p != &local_4e8.field_2) {
          operator_delete(local_4e8._M_dataplus._M_p,local_4e8.field_2._M_allocated_capacity + 1);
        }
      }
      std::_Deque_base<Production_*,_std::allocator<Production_*>_>::~_Deque_base(&local_410);
      if (ppPVar3 == ppPVar2) break;
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
    } while ((_Rb_tree_header *)p_Var9 != &local_4a0._M_impl.super__Rb_tree_header);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_470);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_440);
  std::
  _Rb_tree<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>,_std::_Identity<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::less<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>,_std::allocator<std::stack<Production_*,_std::deque<Production_*,_std::allocator<Production_*>_>_>_>_>
  ::~_Rb_tree(&local_4a0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
    operator_delete(local_4c0._M_dataplus._M_p,local_4c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream(local_3c0);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  return;
}

Assistant:

AST::AST(std::string filename) {

    std::cout << "Creating an AST for " << filename << std::endl;

    if (!GLRP::getInstance().isLoaded()) {
        GLRP::getInstance().loadParser();
    }
    GLRParser *glrParser = GLRP::getInstance().getGlrParser();

//      glrParser->toDot("output/glrParser.dot");

    std::cout << "Parsing string..." << std::endl;

    // Get the contents of the file (Source: https://stackoverflow.com/questions/2602013/read-whole-ascii-file-into-c-stdstring)
    std::ifstream t(filename);
    std::stringstream buffer;
    buffer << t.rdbuf();
    std::string parseString = buffer.str();

    // Parse the contents of the file
    std::set<std::stack<Production *>> parsedVersions = glrParser->parseString(parseString);

    std::cout << "Done parsing" << std::endl;


    // Analyze the result of the parsing
    if (parsedVersions.size() == 0) {
        // No possible parse combinations found
        std::cerr << "Error parsing: Incorrect code" << std::endl;
        throw std::runtime_error("Parsing error");
    } else {

        if (parsedVersions.size() > 1) {
            // Multiple parse combinations possible
            std::cerr << "Error parsing: Code has ambiguities, taking the first one" << std::endl;
        }

        // One unique parse combination found

        // Transform the vector of nonTerminals in a set (Source: https://www.techiedelight.com/convert-vector-set-cpp/)
        std::set<std::string> glrNonTerminals = glrParser->getNonTerminalsV();
        std::set<std::string> nonTerminals(glrNonTerminals.begin(), glrNonTerminals.end());

//        // Get the only element in the set
//        std::stack<Production *> productions = *(parsedVersions.begin());

        int i = 0;
        for (auto productions: parsedVersions) {
            if (productions.empty()) {
                std::cerr << "Error: Empty productions" << std::endl;
                return;
            }
            // Create an ASTree with this list of productions
            ast = new ASTree(productions, nonTerminals, productions.top()->getFromP(), nullptr);
//            filename = "output/parsed" + std::to_string(i) + ".dot";
//            ast->toDot(filename);
            i++;
        }
    }
}